

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

double __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GetDouble(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_local;
  Number local_8;
  
  if (((this->data_).f.flags & 0x200) == 0) {
    if (((this->data_).f.flags & 0x20) == 0) {
      if (((this->data_).f.flags & 0x40) == 0) {
        if (((this->data_).f.flags & 0x80) == 0) {
          uVar1 = *(undefined8 *)&this->data_;
          auVar2._8_4_ = (int)((ulong)uVar1 >> 0x20);
          auVar2._0_8_ = uVar1;
          auVar2._12_4_ = 0x45300000;
          local_8.d = (auVar2._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        }
        else {
          local_8.d = (double)*(long *)&this->data_;
        }
      }
      else {
        local_8.d = (double)(this->data_).s.length;
      }
    }
    else {
      local_8.d = (double)(int)(this->data_).s.length;
    }
  }
  else {
    local_8 = (this->data_).n;
  }
  return local_8.d;
}

Assistant:

double GetDouble() const {
        RAPIDJSON_ASSERT(IsNumber());
        if ((data_.f.flags & kDoubleFlag) != 0)                return data_.n.d;   // exact type, no conversion.
        if ((data_.f.flags & kIntFlag) != 0)                   return data_.n.i.i; // int -> double
        if ((data_.f.flags & kUintFlag) != 0)                  return data_.n.u.u; // unsigned -> double
        if ((data_.f.flags & kInt64Flag) != 0)                 return static_cast<double>(data_.n.i64); // int64_t -> double (may lose precision)
        RAPIDJSON_ASSERT((data_.f.flags & kUint64Flag) != 0);  return static_cast<double>(data_.n.u64); // uint64_t -> double (may lose precision)
    }